

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

sptr_t file_read(char *path,char *mode)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  size_t size;
  size_t sVar3;
  uchar *__ptr;
  sptr_t sVar4;
  
  sVar3 = 0;
  __ptr = (uchar *)0x0;
  if (mode != (char *)0x0 && path != (char *)0x0) {
    __stream = fopen(path,mode);
    if (__stream == (FILE *)0x0) {
      perror("Unable to open file for reading\n");
      sVar3 = 0;
      fprintf(_stderr,"File: \"%s\", mode \"%s\"\n",path,mode);
      __ptr = (uchar *)0x0;
    }
    else {
      fseek(__stream,0,2);
      size = ftell(__stream);
      fseek(__stream,0,0);
      __ptr = (uchar *)xmalloc(size);
      sVar3 = fread(__ptr,1,size,__stream);
      if (sVar3 == 0) {
        perror("Unable to read file\n");
        fprintf(_stderr,"File: \"%s\", mode \"%s\"\n",path,mode);
        uVar1 = ferror(__stream);
        if (uVar1 == 0) {
          iVar2 = feof(__stream);
          if (iVar2 != 0) {
            fwrite("Unexpected EOF\n",0xf,1,_stderr);
          }
        }
        else {
          fprintf(_stderr,"IO error %d\n",(ulong)uVar1);
        }
        free(__ptr);
        __ptr = (uchar *)0x0;
      }
      else if (size != sVar3) {
        fprintf(_stderr,"Warning: only %lld of %lld bytes read from \"%s\"\n",sVar3,size,path);
      }
      fclose(__stream);
    }
  }
  sVar4.size = sVar3;
  sVar4.ptr = __ptr;
  return sVar4;
}

Assistant:

sptr_t file_read(const char *path, const char *mode)
{
	sptr_t result = SPTR_NULL;
	if (path == NULL || mode == NULL) {
		return result;
	}
	FILE *f = fopen(path, mode);
	if (!f) {
		perror("Unable to open file for reading\n");
		fprintf(stderr, "File: \"%s\", mode \"%s\"\n", path, mode);
		return result;
	}
	fseek(f, 0, SEEK_END);
	size_t fsize = ftell(f);
	fseek(f, 0, SEEK_SET);

	unsigned char *data = xmalloc(fsize);
	size_t total = fread(data, 1, fsize, f);
	if (total) {
		result.ptr = data;
		result.size = total;
		if (fsize != total) {
			fprintf(stderr, "Warning: only %lld of %lld bytes read from \"%s\"\n", total, fsize, path);
		}
	} else {
		perror("Unable to read file\n");
		fprintf(stderr, "File: \"%s\", mode \"%s\"\n", path, mode);
		if (ferror(f)) {
			fprintf(stderr, "IO error %d\n", ferror(f));
		} else if (feof(f)) {
			fprintf(stderr, "Unexpected EOF\n");
		}
		free(data);
		total = 0;
		data = NULL;
		goto end;
	}
end:
	fclose(f);
	return result;
}